

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
* __thiscall
enact::Parser::parse
          (vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  string local_e0;
  _Alloc_hider local_c0;
  
  std::__cxx11::string::string((string *)&local_e0,(string *)this->m_context);
  Lexer::Lexer((Lexer *)&stack0xffffffffffffff40,&local_e0);
  Lexer::operator=(&this->m_scanner,(Lexer *)&stack0xffffffffffffff40);
  Lexer::~Lexer((Lexer *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string((string *)&local_e0);
  advance(this);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((this->m_current).type != END_OF_FILE) {
    parseStmt((Parser *)&stack0xffffffffffffff40);
    if ((long *)local_c0._M_p != (long *)0x0) {
      std::
      vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
      ::emplace_back<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>
                ((vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)
                 &stack0xffffffffffffff40);
      if ((long *)local_c0._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_c0._M_p + 8))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Stmt>> Parser::parse() {
        m_scanner = Lexer{m_context.getSource()};
        advance();

        std::vector<std::unique_ptr<Stmt>> ast{};
        while (!isAtEnd()) {
            std::unique_ptr<Stmt> stmt = parseStmt();
            if (stmt) ast.push_back(std::move(stmt));
        }

        return ast;
    }